

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *B)

{
  uint uVar1;
  uint8_t *puVar2;
  flatcc_builder_ref_t *data;
  flatcc_builder_union_vec_ref_t fVar3;
  ulong uVar4;
  ulong count;
  
  if (B->frame->type == 7) {
    uVar1 = (B->frame->container).table.pl_end;
    count = (ulong)uVar1;
    data = (flatcc_builder_ref_t *)push_ds(B,uVar1 * 5);
    if (data == (flatcc_builder_ref_t *)0x0) {
      fVar3.type = 0;
      fVar3.value = 0;
    }
    else {
      puVar2 = B->ds;
      for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
        *(uint8_t *)((long)(data + count) + uVar4) = puVar2[uVar4 * 8];
        data[uVar4] = *(flatcc_builder_ref_t *)(puVar2 + uVar4 * 8 + 4);
      }
      fVar3 = flatcc_builder_create_union_vector_direct
                        (B,(flatcc_builder_utype_t *)(data + count),data,count);
      exit_frame(B);
    }
    return fVar3;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_union_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x676,
                "flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *)"
               );
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *B)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };
    flatcc_builder_utype_t *types;
    flatcc_builder_union_ref_t *urefs;
    flatcc_builder_ref_t *refs;
    size_t i, count;

    check(frame(type) == flatcc_builder_union_vector, "expected union vector frame");

    /*
     * We could split the union vector in-place, but then we would have
     * to deal with strict pointer aliasing rules which is not worthwhile
     * so we create a new offset and type vector on the stack.
     *
     * We assume the stack is sufficiently aligned as is.
     */
    count = flatcc_builder_union_vector_count(B);
    if (0 == (refs = push_ds(B, (uoffset_t)(count * (utype_size + field_size))))) {
        return uvref;
    }
    types = (flatcc_builder_utype_t *)(refs + count);

    /* Safe even if push_ds caused stack reallocation. */
    urefs = flatcc_builder_union_vector_edit(B);

    for (i = 0; i < count; ++i) {
        types[i] = urefs[i].type;
        refs[i] = urefs[i].value;
    }
    uvref = flatcc_builder_create_union_vector_direct(B, types, refs, count);
    /* No need to clean up after out temporary types vector. */
    exit_frame(B);
    return uvref;
}